

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcborvalue.cpp
# Opt level: O0

QCborValueRef __thiscall QCborValue::operator[](QCborValue *this,QLatin1StringView key)

{
  long lVar1;
  QLatin1String key_00;
  char *in_RSI;
  long in_FS_OFFSET;
  QCborValueConstRef QVar2;
  QCborValue *in_stack_ffffffffffffffb8;
  qsizetype in_stack_ffffffffffffffd0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  key_00.m_data = in_RSI;
  key_00.m_size = in_stack_ffffffffffffffd0;
  QVar2 = (QCborValueConstRef)
          QCborContainerPrivate::findOrAddMapKey<QLatin1String>(in_stack_ffffffffffffffb8,key_00);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (QCborValueRef)QVar2;
  }
  __stack_chk_fail();
}

Assistant:

QCborValueRef QCborValue::operator[](QLatin1StringView key)
{
    return QCborContainerPrivate::findOrAddMapKey(*this, key);
}